

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *params,
          char (*params_1) [46],unsigned_long *params_2,uint *params_3,uint *params_4,
          Reader *params_5)

{
  undefined4 in_register_00000014;
  char (*params_00) [46];
  unsigned_long *params_01;
  uint *params_02;
  uint *params_03;
  Reader *params_04;
  long lVar1;
  String argValues [6];
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&>
            (argValues,(kj *)params,
             (DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *)
             CONCAT44(in_register_00000014,line));
  str<char_const(&)[46]>(argValues + 1,(kj *)params_1,params_00);
  str<unsigned_long&>(argValues + 2,(kj *)params_2,params_01);
  str<unsigned_int&>(argValues + 3,(kj *)params_3,params_02);
  str<unsigned_int&>(argValues + 4,(kj *)params_4,params_03);
  str<capnp::Text::Reader&>(argValues + 5,(kj *)params_5,params_04);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x78;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}